

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Matrix44<float> * __thiscall Imath_3_2::Quat<float>::toMatrix44(Quat<float> *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Matrix44<float> *in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar12 = this->r;
  fVar1 = (this->v).x;
  uVar2 = (this->v).y;
  uVar4 = (this->v).z;
  fVar7 = (float)uVar2 * (float)uVar4 + fVar1 * fVar12;
  uVar3 = (this->v).x;
  uVar5 = (this->v).y;
  fVar13 = (float)uVar2 * (float)uVar2 + (float)uVar4 * (float)uVar4;
  fVar6 = fVar1 * (float)uVar2 - (float)uVar4 * fVar12;
  fVar9 = fVar1 * (float)uVar2 + (float)uVar4 * fVar12;
  fVar10 = fVar1 * (float)uVar4 + -(fVar12 * (float)uVar2);
  fVar11 = (float)uVar4 * (float)uVar4 + fVar1 * fVar1;
  fVar8 = (float)uVar2 * (float)uVar2 + fVar1 * fVar1;
  in_RDI->x[0][0] = 1.0 - (fVar13 + fVar13);
  *(ulong *)(in_RDI->x[0] + 1) = CONCAT44(fVar10 + fVar10,fVar9 + fVar9);
  in_RDI->x[0][3] = 0.0;
  in_RDI->x[1][0] = fVar6 + fVar6;
  in_RDI->x[1][1] = 1.0 - (fVar11 + fVar11);
  in_RDI->x[1][2] = fVar7 + fVar7;
  in_RDI->x[1][3] = 0.0;
  fVar6 = (float)uVar3 * (float)uVar4 + fVar12 * (float)uVar2;
  fVar12 = (float)uVar5 * (float)uVar4 + -(fVar1 * fVar12);
  *(ulong *)in_RDI->x[2] = CONCAT44(fVar12 + fVar12,fVar6 + fVar6);
  in_RDI->x[2][2] = 1.0 - (fVar8 + fVar8);
  *(undefined8 *)(in_RDI->x[2] + 3) = 0;
  *(float *)((long)(in_RDI->x + 3) + 4) = 0.0;
  *(float *)((long)(in_RDI->x + 3) + 8) = 0.0;
  in_RDI->x[3][3] = 1.0;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix44<T>
Quat<T>::toMatrix44 () const IMATH_NOEXCEPT
{
    return Matrix44<T> (
        1 - 2 * (v.y * v.y + v.z * v.z),
        2 * (v.x * v.y + v.z * r),
        2 * (v.z * v.x - v.y * r),
        0,
        2 * (v.x * v.y - v.z * r),
        1 - 2 * (v.z * v.z + v.x * v.x),
        2 * (v.y * v.z + v.x * r),
        0,
        2 * (v.z * v.x + v.y * r),
        2 * (v.y * v.z - v.x * r),
        1 - 2 * (v.y * v.y + v.x * v.x),
        0,
        0,
        0,
        0,
        1);
}